

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void wabt::anon_unknown_1::AppendInlineExportFields
               (Module *module,ModuleFieldList *fields,Index index)

{
  bool bVar1;
  reference pvVar2;
  Var local_d0;
  ExportModuleField *local_88;
  ExportModuleField *export_field;
  ModuleField *field;
  intrusive_list<wabt::ModuleField> *local_70;
  undefined1 local_68 [8];
  iterator __end2;
  iterator __begin2;
  ModuleFieldList *__range2;
  Location last_field_loc;
  Index index_local;
  ModuleFieldList *fields_local;
  Module *module_local;
  
  last_field_loc.field_1._12_4_ = index;
  pvVar2 = intrusive_list<wabt::ModuleField>::back(&module->fields);
  __range2 = (ModuleFieldList *)(pvVar2->loc).filename.data_;
  last_field_loc.filename.data_ = (char *)(pvVar2->loc).filename.size_;
  last_field_loc.filename.size_ = (pvVar2->loc).field_1.field_1.offset;
  last_field_loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       *(size_t *)((long)&(pvVar2->loc).field_1 + 8);
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(fields);
  _local_68 = intrusive_list<wabt::ModuleField>::end(fields);
  while( true ) {
    field = (ModuleField *)local_68;
    local_70 = __end2.list_;
    bVar1 = intrusive_list<wabt::ModuleField>::iterator::operator!=
                      ((iterator *)&__end2.node_,_local_68);
    if (!bVar1) break;
    export_field = (ExportModuleField *)
                   intrusive_list<wabt::ModuleField>::iterator::operator*((iterator *)&__end2.node_)
    ;
    local_88 = cast<wabt::ExportModuleField,wabt::ModuleField>((ModuleField *)export_field);
    Var::Var(&local_d0,last_field_loc.field_1._12_4_,(Location *)&__range2);
    Var::operator=(&(local_88->export_).var,&local_d0);
    Var::~Var(&local_d0);
    intrusive_list<wabt::ModuleField>::iterator::operator++((iterator *)&__end2.node_);
  }
  Module::AppendFields(module,fields);
  return;
}

Assistant:

void AppendInlineExportFields(Module* module,
                              ModuleFieldList* fields,
                              Index index) {
  Location last_field_loc = module->fields.back().loc;

  for (ModuleField& field : *fields) {
    auto* export_field = cast<ExportModuleField>(&field);
    export_field->export_.var = Var(index, last_field_loc);
  }

  module->AppendFields(fields);
}